

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::QHostAddress(QHostAddress *this,SpecialAddress address)

{
  QHostAddressPrivate *this_00;
  QHostAddress *in_RDI;
  QHostAddressPrivate *in_stack_ffffffffffffffd8;
  
  this_00 = (QHostAddressPrivate *)operator_new(0x38);
  QHostAddressPrivate::QHostAddressPrivate(this_00);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)this_00,in_stack_ffffffffffffffd8)
  ;
  setAddress(in_RDI,(SpecialAddress)((ulong)this_00 >> 0x20));
  return;
}

Assistant:

QHostAddress::QHostAddress(SpecialAddress address)
    : d(new QHostAddressPrivate)
{
    setAddress(address);
}